

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::scoutcrossedge
          (tetgenmesh *this,triface *crosstet,arraypool *missingshbds,arraypool *missingshs)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  interresult iVar5;
  point pdVar6;
  point pdVar7;
  point pdVar8;
  point pdVar9;
  point C;
  undefined1 local_130 [8];
  triface chkface;
  face checkseg;
  face tmpseg;
  uint local_f8;
  int j;
  int i;
  int t1ver;
  int interflag;
  int searchflag;
  int poss [4];
  int local_d0 [2];
  int types [2];
  double ori;
  point pe;
  point pd;
  point pc;
  point pb;
  point pa;
  face neighseg;
  face *parysh;
  face searchsh;
  face oldsh;
  triface neightet;
  triface spintet;
  triface searchtet;
  arraypool *missingshs_local;
  arraypool *missingshbds_local;
  triface *crosstet_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&spintet.ver);
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)&oldsh.shver);
  face::face((face *)&searchsh.shver);
  face::face((face *)&parysh);
  face::face((face *)&pa);
  bVar4 = false;
  local_f8 = 0;
  while( true ) {
    bVar3 = false;
    if ((long)(int)local_f8 < missingshbds->objects) {
      bVar3 = (bool)(bVar4 ^ 1);
    }
    if (!bVar3) break;
    neighseg._8_8_ =
         missingshbds->toparray[(int)local_f8 >> ((byte)missingshbds->log2objectsperblock & 0x1f)] +
         (int)((local_f8 & missingshbds->objectsperblockmark) * missingshbds->objectbytes);
    sspivot(this,(face *)neighseg._8_8_,(face *)&pa);
    sstpivot1(this,(face *)&pa,(triface *)&spintet.ver);
    pdVar6 = org(this,(triface *)&spintet.ver);
    pdVar7 = sorg(this,(face *)neighseg._8_8_);
    if (pdVar6 != pdVar7) {
      esymself(this,(triface *)&spintet.ver);
    }
    triface::operator=((triface *)&neightet.ver,(triface *)&spintet.ver);
    do {
      pdVar6 = apex(this,(triface *)&neightet.ver);
      bVar3 = pmarktested(this,pdVar6);
      if (bVar3) {
        triface::operator=((triface *)&oldsh.shver,(triface *)&neightet.ver);
        face::operator=((face *)&searchsh.shver,(face *)neighseg._8_8_);
        for (tmpseg._12_4_ = 0; (int)tmpseg._12_4_ < 2; tmpseg._12_4_ = tmpseg._12_4_ + 1) {
          enextself(this,(triface *)&oldsh.shver);
          if ((*(long *)(oldsh._8_8_ + 0x40) == 0) ||
             (*(long *)(*(long *)(oldsh._8_8_ + 0x40) + (long)ver2edge[(int)neightet.tet] * 8) == 0)
             ) {
            if (tmpseg._12_4_ == 0) {
              senext(this,(face *)&searchsh.shver,(face *)&parysh);
            }
            else {
              senext2(this,(face *)&searchsh.shver,(face *)&parysh);
              sesymself(this,(face *)&parysh);
              esymself(this,(triface *)&oldsh.shver);
            }
            pdVar6 = sorg(this,(face *)&parysh);
            pdVar7 = sdest(this,(face *)&parysh);
            pdVar8 = sapex(this,(face *)&parysh);
            pdVar9 = dest(this,(triface *)&oldsh.shver);
            calculateabovepoint4(this,pdVar6,pdVar7,pdVar8,pdVar9);
            types = (int  [2])orient3d(pdVar6,pdVar7,pdVar8,this->dummypoint);
            if ((double)types <= 0.0) {
              if (((double)types == 0.0) && (!NAN((double)types))) {
                terminatetetgen(this,2);
              }
            }
            else {
              sesymself(this,(face *)&parysh);
              senextself(this,(face *)&parysh);
            }
            pdVar6 = dest(this,(triface *)&oldsh.shver);
            iVar5 = sscoutsegment(this,(face *)&parysh,pdVar6,0,0,1);
            if (iVar5 == SHAREEDGE) {
              face::face((face *)&checkseg.shver);
              makeshellface(this,this->subsegs,(face *)&checkseg.shver);
              ssbond(this,(face *)&parysh,(face *)&checkseg.shver);
              spivotself(this,(face *)&parysh);
              ssbond(this,(face *)&parysh,(face *)&checkseg.shver);
              lawsonflip(this);
              spivot(this,(face *)&checkseg.shver,(face *)&parysh);
              ssdissolve(this,(face *)&parysh);
              spivotself(this,(face *)&parysh);
              ssdissolve(this,(face *)&parysh);
              shellfacedealloc(this,this->subsegs,(shellface *)checkseg._8_8_);
              bVar4 = true;
            }
            else if (this->flipstack != (badface *)0x0) {
              lawsonflip(this);
            }
            break;
          }
        }
        if (bVar4) break;
      }
      iVar2 = (int)spintet.tet;
      decode(this,*(tetrahedron *)(neightet._8_8_ + (long)facepivot1[(int)spintet.tet] * 8),
             (triface *)&neightet.ver);
      spintet.tet._0_4_ = facepivot2[iVar2][(int)spintet.tet];
    } while (neightet._8_8_ != spintet._8_8_);
    local_f8 = local_f8 + 1;
  }
  if (bVar4) {
    face::face((face *)&chkface.ver);
    for (local_f8 = 0; (long)(int)local_f8 < missingshs->objects; local_f8 = local_f8 + 1) {
      neighseg._8_8_ =
           missingshs->toparray[(int)local_f8 >> ((byte)missingshs->log2objectsperblock & 0x1f)] +
           (int)((local_f8 & missingshs->objectsperblockmark) * missingshs->objectbytes);
      face::operator=((face *)&searchsh.shver,(face *)neighseg._8_8_);
      for (tmpseg._12_4_ = 0; (int)tmpseg._12_4_ < 3; tmpseg._12_4_ = tmpseg._12_4_ + 1) {
        if (*(long *)(searchsh._8_8_ + (long)(((int)oldsh.sh >> 1) + 6) * 8) != 0) {
          sspivot(this,(face *)&searchsh.shver,(face *)&chkface.ver);
          bVar4 = sinfected(this,(face *)&chkface.ver);
          if (bVar4) {
            sstpivot1(this,(face *)&chkface.ver,(triface *)&spintet.ver);
            triface::operator=((triface *)&neightet.ver,(triface *)&spintet.ver);
            do {
              tssdissolve1(this,(triface *)&neightet.ver);
              iVar2 = (int)spintet.tet;
              decode(this,*(tetrahedron *)(neightet._8_8_ + (long)facepivot1[(int)spintet.tet] * 8),
                     (triface *)&neightet.ver);
              spintet.tet._0_4_ = facepivot2[iVar2][(int)spintet.tet];
            } while (neightet._8_8_ != spintet._8_8_);
            shellfacedealloc(this,this->subsegs,(shellface *)chkface._8_8_);
            ssdissolve(this,(face *)&searchsh.shver);
          }
        }
        senextself(this,(face *)&searchsh.shver);
      }
    }
    this->fillregioncount = this->fillregioncount + 1;
    return 0;
  }
  t1ver = 0;
  tmpseg._12_4_ = 0;
LAB_0014185c:
  if (missingshbds->objects <= (long)(int)tmpseg._12_4_ || t1ver != 0) {
    return t1ver;
  }
  neighseg._8_8_ =
       missingshbds->toparray
       [(int)tmpseg._12_4_ >> ((byte)missingshbds->log2objectsperblock & 0x1f)] +
       (tmpseg._12_4_ & missingshbds->objectsperblockmark) * missingshbds->objectbytes;
  sspivot(this,(face *)neighseg._8_8_,(face *)&pa);
  sstpivot1(this,(face *)&pa,(triface *)&spintet.ver);
  i = 0;
  triface::operator=((triface *)&neightet.ver,(triface *)&spintet.ver);
LAB_00141919:
  pdVar6 = apex(this,(triface *)&neightet.ver);
  pdVar7 = oppo(this,(triface *)&neightet.ver);
  if ((((pdVar6 != this->dummypoint) && (pdVar7 != this->dummypoint)) &&
      (bVar4 = pmarktested(this,pdVar6), !bVar4)) && (bVar4 = pmarktested(this,pdVar7), !bVar4)) {
    for (local_f8 = 0; (long)(int)local_f8 < missingshs->objects && i == 0; local_f8 = local_f8 + 1)
    {
      neighseg._8_8_ =
           missingshs->toparray[(int)local_f8 >> ((byte)missingshs->log2objectsperblock & 0x1f)] +
           (int)((local_f8 & missingshs->objectsperblockmark) * missingshs->objectbytes);
      pdVar8 = sorg(this,(face *)neighseg._8_8_);
      pdVar9 = sdest(this,(face *)neighseg._8_8_);
      C = sapex(this,(face *)neighseg._8_8_);
      i = tri_edge_test(this,pdVar8,pdVar9,C,pdVar6,pdVar7,(point)0x0,1,local_d0,&interflag);
      if (0 < i) {
        if (i == 2) {
          if ((local_d0[0] == 9) || (local_d0[0] == 8)) {
            edestoppo(this,(triface *)&neightet.ver,crosstet);
            if ((crosstet->tet[8] == (tetrahedron)0x0) ||
               (crosstet->tet[8][ver2edge[crosstet->ver]] == (double *)0x0)) {
              local_130 = (undefined1  [8])crosstet->tet;
              chkface.tet = *(tetrahedron **)&crosstet->ver;
              goto LAB_00141bbb;
            }
            report_selfint_face(this,pdVar8,pdVar9,C,(face *)neighseg._8_8_,crosstet,2,local_d0,
                                &interflag);
            goto LAB_00141cd8;
          }
          report_selfint_face(this,pdVar8,pdVar9,C,(face *)neighseg._8_8_,crosstet,2,local_d0,
                              &interflag);
        }
        break;
      }
    }
  }
  goto LAB_00141d94;
  while( true ) {
    decode(this,*(tetrahedron *)((long)local_130 + (long)(int)((uint)chkface.tet & 3) * 8),
           (triface *)local_130);
    chkface.tet = (tetrahedron *)
                  CONCAT44(chkface.tet._4_4_,fsymtbl[(int)uVar1][(int)(uint)chkface.tet]);
    if (local_130 == (undefined1  [8])crosstet->tet) break;
LAB_00141bbb:
    uVar1 = (uint)chkface.tet;
    if ((*(tetrahedron *)((long)local_130 + 0x48) != (tetrahedron)0x0) &&
       ((*(tetrahedron *)((long)local_130 + 0x48))[(int)((uint)chkface.tet & 3)] != (double *)0x0))
    break;
  }
  if ((*(tetrahedron *)((long)local_130 + 0x48) != (tetrahedron)0x0) &&
     ((*(tetrahedron *)((long)local_130 + 0x48))[(int)((uint)chkface.tet & 3)] != (double *)0x0)) {
    report_selfint_face(this,pdVar8,pdVar9,C,(face *)neighseg._8_8_,(triface *)local_130,2,local_d0,
                        &interflag);
  }
LAB_00141cd8:
  types = (int  [2])orient3d(pdVar8,pdVar9,C,pdVar6);
  if ((double)types < 0.0) {
    esymself(this,crosstet);
  }
  t1ver = 1;
LAB_00141d94:
  iVar2 = (int)spintet.tet;
  if (0 < i) goto LAB_00141dff;
  decode(this,*(tetrahedron *)(neightet._8_8_ + (long)facepivot1[(int)spintet.tet] * 8),
         (triface *)&neightet.ver);
  spintet.tet._0_4_ = facepivot2[iVar2][(int)spintet.tet];
  if (neightet._8_8_ == spintet._8_8_) goto LAB_00141dff;
  goto LAB_00141919;
LAB_00141dff:
  tmpseg._12_4_ = tmpseg._12_4_ + 1;
  goto LAB_0014185c;
}

Assistant:

int tetgenmesh::scoutcrossedge(triface& crosstet, arraypool* missingshbds, 
                               arraypool* missingshs)
{
  triface searchtet, spintet, neightet;
  face oldsh, searchsh, *parysh;
  face neighseg;
  point pa, pb, pc, pd, pe;
  REAL ori;
  int types[2], poss[4];
  int searchflag, interflag;
  int t1ver;
  int i, j;

  searchflag = 0;

  // Search the first new subface to fill the region.
  for (i = 0; i < missingshbds->objects && !searchflag; i++) {
    parysh = (face *) fastlookup(missingshbds, i);
    sspivot(*parysh, neighseg);
    sstpivot1(neighseg, searchtet);
    if (org(searchtet) != sorg(*parysh)) {
      esymself(searchtet);
    }
    spintet = searchtet;
    while (1) {
      if (pmarktested(apex(spintet))) {
        // A possible interior face.
        neightet = spintet;
        oldsh = *parysh;
		// Try to recover an interior edge.
		for (j = 0; j < 2; j++) {
		  enextself(neightet);
          if (!issubseg(neightet)) {
			if (j == 0) {
              senext(oldsh, searchsh);
            } else {
              senext2(oldsh, searchsh);
              sesymself(searchsh);
		      esymself(neightet);
            }
            // Calculate a lifted point. 
			pa = sorg(searchsh);
            pb = sdest(searchsh);
            pc = sapex(searchsh);
            pd = dest(neightet);
            calculateabovepoint4(pa, pb, pc, pd);
            // The lifted point must lie above 'searchsh'.
			ori = orient3d(pa, pb, pc, dummypoint);
			if (ori > 0) {
		      sesymself(searchsh);
		      senextself(searchsh);
		    } else if (ori == 0) {
		      terminatetetgen(this, 2);
		    }
			if (sscoutsegment(&searchsh,dest(neightet),0,0,1)==SHAREEDGE) {
              // Insert a temp segment to protect the recovered edge.
              face tmpseg;
              makeshellface(subsegs, &tmpseg);
              ssbond(searchsh, tmpseg);
              spivotself(searchsh);
              ssbond(searchsh, tmpseg);
              // Recover locally Delaunay edges.
              lawsonflip();
              // Delete the tmp segment.
              spivot(tmpseg, searchsh);
              ssdissolve(searchsh);
              spivotself(searchsh);
              ssdissolve(searchsh);
              shellfacedealloc(subsegs, tmpseg.sh);
			  searchflag = 1;
            } else {
              // Undo the performed flips.
              if (flipstack != NULL) {
                lawsonflip();
              }
            }
            break;
          } // if (!issubseg(neightet))
		} // j
        if (searchflag) break;
      } // if (pmarktested(apex(spintet)))
      fnextself(spintet);
      if (spintet.tet == searchtet.tet) break;
    }
  } // i

  if (searchflag) {
	// Remove faked segments.
    face checkseg;
    // Remark: We should not use the array 'missingshbds', since the flips may
    //   change the subfaces. We search them from the subfaces in R.
    for (i = 0; i < missingshs->objects; i++) {
      parysh = (face *) fastlookup(missingshs, i);
      oldsh = *parysh;
      for (j = 0; j < 3; j++) {
        if (isshsubseg(oldsh)) {
          sspivot(oldsh, checkseg);
          if (sinfected(checkseg)) {
            // It's a faked segment. Delete it.
            sstpivot1(checkseg, searchtet);
            spintet = searchtet;
            while (1) {
              tssdissolve1(spintet);
              fnextself(spintet);
              if (spintet.tet == searchtet.tet) break;
            }
            shellfacedealloc(subsegs, checkseg.sh);
            ssdissolve(oldsh);
          }
        }
        senextself(oldsh);
      } // j
    }

    fillregioncount++;

    return 0;
  } // if (i < missingshbds->objects)

  searchflag = 0;

  for (j = 0; j < missingshbds->objects && !searchflag; j++) {
    parysh = (face *) fastlookup(missingshbds, j);
    sspivot(*parysh, neighseg);
    sstpivot1(neighseg, searchtet);
    interflag = 0;
    // Let 'spintet' be [#,#,d,e] where [#,#] is the boundary edge of R.
    spintet = searchtet;
    while (1) {
      pd = apex(spintet);
      pe = oppo(spintet);
      // Skip a hull edge.
      if ((pd != dummypoint) && (pe != dummypoint)) {
        // Skip an edge containing a vertex of R.
        if (!pmarktested(pd) && !pmarktested(pe)) {
          // Check if [d,e] intersects R.
          for (i = 0; i < missingshs->objects && !interflag; i++) {
            parysh = (face *) fastlookup(missingshs, i);
            pa = sorg(*parysh);
            pb = sdest(*parysh);
            pc = sapex(*parysh);
            interflag=tri_edge_test(pa, pb, pc, pd, pe, NULL, 1, types, poss);
            if (interflag > 0) { 
              if (interflag == 2) {
                // They intersect at a single point.
				if ((types[0] == (int) ACROSSFACE) ||
				    (types[0] == (int) ACROSSEDGE)) {
                  // Go to the crossing edge [d,e,#,#].
                  edestoppo(spintet, crosstet); // // [d,e,#,#].
                  if (issubseg(crosstet)) {
				    // It is a segment. Report a PLC problem.
				    report_selfint_face(pa, pb, pc, parysh, &crosstet, 
					                    interflag, types, poss);
                  } else {
				    triface chkface = crosstet;
					while (1) {
					  if (issubface(chkface)) break;
					  fsymself(chkface);
					  if (chkface.tet == crosstet.tet) break;
					}
					if (issubface(chkface)) {
					  // Two subfaces are intersecting.
                      report_selfint_face(pa, pb, pc, parysh, &chkface, 
					                    interflag, types, poss);
					}
				  }
                  // Adjust the edge such that d lies below [a,b,c].
                  ori = orient3d(pa, pb, pc, pd);
                  if (ori < 0) {
                    esymself(crosstet);
                  }
                  searchflag = 1;                  
                } else {
                  // An improper intersection type, ACROSSVERT, TOUCHFACE,
				  //   TOUCHEDGE, SHAREVERT, ...
                  // Maybe it is due to a PLC problem.
				  report_selfint_face(pa, pb, pc, parysh, &crosstet, 
					                  interflag, types, poss);
                }
              }
              break;
            } // if (interflag > 0)
          }
        } 
      }
      // Leave search at this bdry edge if an intersection is found.
      if (interflag > 0) break;
      // Go to the next tetrahedron.
      fnextself(spintet);
      if (spintet.tet == searchtet.tet) break; 
    } // while (1)
  } // j

  return searchflag;
}